

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_edit_player_stat(command *cmd)

{
  uint32_t *puVar1;
  player_upkeep *ppVar2;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  wchar_t stat;
  wchar_t newv;
  char s [80];
  char prompt [80];
  wchar_t local_c0;
  int local_bc;
  char local_b8 [80];
  char local_68 [80];
  
  if (edit_player_state != EDIT_PLAYER_BREAK) {
    wVar5 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_c0);
    if (wVar5 != L'\0') {
      strnfmt(local_68,0x50,"Edit which stat (name or 0-%d): ",4);
      pcVar7 = stat_idx_to_name(L'\0');
      strnfmt(local_b8,0x50,"%s",pcVar7);
      _Var4 = get_string(local_68,local_b8,0x50);
      if (!_Var4) {
        return;
      }
      _Var4 = get_int_from_string(local_b8,&local_c0);
      if ((!_Var4) && (local_c0 = stat_name_to_idx(local_b8), local_c0 < L'\0')) {
        return;
      }
      cmd_set_arg_choice((command_conflict *)cmd,"choice",local_c0);
    }
    if ((uint)local_c0 < 5) {
      pcVar7 = stat_idx_to_name(local_c0);
      strnfmt(local_68,0x50,"%s (3-118): ",pcVar7);
      strnfmt(local_b8,0x50,"%d",(ulong)(uint)(int)player->stat_max[local_c0]);
      _Var4 = get_string(local_68,local_b8,0x50);
      if ((_Var4) && (_Var4 = get_int_from_string(local_b8,&local_bc), ppVar3 = player, _Var4)) {
        iVar8 = 3;
        if (3 < local_bc) {
          iVar8 = local_bc;
        }
        iVar6 = 0x76;
        if (iVar8 < 0x76) {
          iVar6 = iVar8;
        }
        player->stat_max[local_c0] = (int16_t)iVar6;
        ppVar3->stat_cur[local_c0] = (int16_t)iVar6;
        ppVar2 = ppVar3->upkeep;
        puVar1 = &ppVar2->update;
        *puVar1 = *puVar1 | 1;
        puVar1 = &ppVar2->redraw;
        *(byte *)puVar1 = (byte)*puVar1 | 0x10;
      }
      else {
        edit_player_state = EDIT_PLAYER_BREAK;
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_edit_player_stat(struct command *cmd)
{
	int stat, newv;
	char prompt[80], s[80];

	if (edit_player_state == EDIT_PLAYER_BREAK) return;

	if (cmd_get_arg_choice(cmd, "choice", &stat) != CMD_OK) {
		strnfmt(prompt, sizeof(prompt),
			"Edit which stat (name or 0-%d): ", STAT_MAX - 1);

		/* Set default value. */
		strnfmt(s, sizeof(s), "%s", stat_idx_to_name(0));

		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &stat)) {
			stat = stat_name_to_idx(s);
			if (stat < 0) {
				return;
			}
		}

		cmd_set_arg_choice(cmd, "choice", stat);
	}

	if (stat < 0 || stat >= STAT_MAX) {
		return;
	}

	strnfmt(prompt, sizeof(prompt), "%s (3-118): ", stat_idx_to_name(stat));

	/* Set default value. */
	strnfmt(s, sizeof(s), "%d", player->stat_max[stat]);

	if (!get_string(prompt, s, sizeof(s)) ||
			!get_int_from_string(s, &newv)) {
		/* Set next editing stage to break. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}

	/* Limit to the range of [3, 118]. */
	newv = MIN(118, MAX(3, newv));

	player->stat_cur[stat] = player->stat_max[stat] = newv;

	/* Flag what needs to be updated or redrawn. */
	player->upkeep->update |= (PU_BONUS);
	player->upkeep->redraw |= (PR_STATS);
}